

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::MILSpec::Value::~Value(Value *this)

{
  ~Value(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

Value::~Value() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.MILSpec.Value)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}